

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O0

int DispatchAlpha_SSE2(uint8_t *alpha,int alpha_stride,int width,int height,uint8_t *dst,
                      int dst_stride)

{
  ulong uVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  byte bVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  ulong *in_R8;
  int in_R9D;
  __m128i a2_lo;
  __m128i a1;
  __m128i a0;
  __m128i *out;
  int limit;
  __m128i all_alphas;
  __m128i all_0xff;
  __m128i rgb_mask;
  __m128i zero;
  int j;
  int i;
  uint32_t alpha_and;
  ulong *local_278;
  ulong local_268;
  int local_228;
  int local_224;
  ulong *local_218;
  long local_200;
  byte local_1b8;
  undefined1 uStack_1b7;
  byte bStack_1b6;
  undefined1 uStack_1b5;
  byte bStack_1b4;
  undefined1 uStack_1b3;
  byte bStack_1b2;
  undefined1 uStack_1b1;
  uint32_t alpha_value;
  __m128i b2_hi;
  __m128i b2_lo;
  __m128i b1_hi;
  __m128i b1_lo;
  __m128i b0_hi;
  __m128i b0_lo;
  __m128i a2_hi;
  
  bVar4 = 0xff;
  local_268 = 0xffffffffffffffff;
  local_218 = in_R8;
  local_200 = in_RDI;
  for (local_228 = 0; local_228 < in_ECX; local_228 = local_228 + 1) {
    local_278 = local_218;
    for (local_224 = 0; local_224 < (int)(in_EDX - 1U & 0xfffffff8); local_224 = local_224 + 8) {
      uVar1 = *(ulong *)(local_200 + local_224);
      local_1b8 = (byte)uVar1;
      uStack_1b7 = (undefined1)(uVar1 >> 8);
      bStack_1b6 = (byte)(uVar1 >> 0x10);
      uStack_1b5 = (undefined1)(uVar1 >> 0x18);
      bStack_1b4 = (byte)(uVar1 >> 0x20);
      uStack_1b3 = (undefined1)(uVar1 >> 0x28);
      bStack_1b2 = (byte)(uVar1 >> 0x30);
      uStack_1b1 = (undefined1)(uVar1 >> 0x38);
      *local_278 = *local_278 & 0xffffff00ffffff00 |
                   (ulong)((uint6)CONCAT14(uStack_1b7,(uint)CONCAT12(uStack_1b7,(ushort)local_1b8))
                          & 0xffff0000ffff);
      local_278[1] = local_278[1] & 0xffffff00ffffff00 |
                     (ulong)CONCAT14(uStack_1b5,(uint)bStack_1b6);
      local_278[2] = local_278[2] & 0xffffff00ffffff00 |
                     (ulong)((uint6)CONCAT14(uStack_1b3,
                                             (uint)CONCAT12(uStack_1b3,(ushort)bStack_1b4)) &
                            0xffff0000ffff);
      local_278[3] = local_278[3] & 0xffffff00ffffff00 |
                     (ulong)CONCAT14(uStack_1b1,(uint)bStack_1b2);
      local_268 = local_268 & uVar1;
      local_278 = local_278 + 4;
    }
    for (; local_224 < in_EDX; local_224 = local_224 + 1) {
      bVar2 = *(byte *)(local_200 + local_224);
      *(byte *)((long)local_218 + (long)(local_224 << 2)) = bVar2;
      bVar4 = bVar2 & bVar4;
    }
    local_200 = local_200 + in_ESI;
    local_218 = (ulong *)((long)local_218 + (long)in_R9D);
  }
  b0_lo[1]._0_1_ = (char)local_268;
  b0_lo[1]._1_1_ = (char)(local_268 >> 8);
  b0_lo[1]._2_1_ = (char)(local_268 >> 0x10);
  b0_lo[1]._3_1_ = (char)(local_268 >> 0x18);
  b0_lo[1]._4_1_ = (char)(local_268 >> 0x20);
  b0_lo[1]._5_1_ = (char)(local_268 >> 0x28);
  b0_lo[1]._6_1_ = (char)(local_268 >> 0x30);
  b0_lo[1]._7_1_ = (char)(local_268 >> 0x38);
  auVar3[1] = -(b0_lo[1]._1_1_ == -1);
  auVar3[0] = -((char)b0_lo[1] == -1);
  auVar3[2] = -(b0_lo[1]._2_1_ == -1);
  auVar3[3] = -(b0_lo[1]._3_1_ == -1);
  auVar3[4] = -(b0_lo[1]._4_1_ == -1);
  auVar3[5] = -(b0_lo[1]._5_1_ == -1);
  auVar3[6] = -(b0_lo[1]._6_1_ == -1);
  auVar3[7] = -(b0_lo[1]._7_1_ == -1);
  auVar3[8] = 0xff;
  auVar3[9] = 0xff;
  auVar3[10] = 0xff;
  auVar3[0xb] = 0xff;
  auVar3[0xc] = 0xff;
  auVar3[0xd] = 0xff;
  auVar3[0xe] = 0xff;
  auVar3[0xf] = 0xff;
  return (int)(((SUB161(auVar3 >> 7,0) & 1 | (SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (SUB161(auVar3 >> 0x17,0) & 1) << 2 | (SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (SUB161(auVar3 >> 0x27,0) & 1) << 4 | (SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (SUB161(auVar3 >> 0x37,0) & 1) << 6 | SUB161(auVar3 >> 0x3f,0) << 7) & bVar4) !=
              0xff);
}

Assistant:

static int DispatchAlpha_SSE2(const uint8_t* WEBP_RESTRICT alpha,
                              int alpha_stride, int width, int height,
                              uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  // alpha_and stores an 'and' operation of all the alpha[] values. The final
  // value is not 0xff if any of the alpha[] is not equal to 0xff.
  uint32_t alpha_and = 0xff;
  int i, j;
  const __m128i zero = _mm_setzero_si128();
  const __m128i rgb_mask = _mm_set1_epi32((int)0xffffff00);  // to preserve RGB
  const __m128i all_0xff = _mm_set_epi32(0, 0, ~0, ~0);
  __m128i all_alphas = all_0xff;

  // We must be able to access 3 extra bytes after the last written byte
  // 'dst[4 * width - 4]', because we don't know if alpha is the first or the
  // last byte of the quadruplet.
  const int limit = (width - 1) & ~7;

  for (j = 0; j < height; ++j) {
    __m128i* out = (__m128i*)dst;
    for (i = 0; i < limit; i += 8) {
      // load 8 alpha bytes
      const __m128i a0 = _mm_loadl_epi64((const __m128i*)&alpha[i]);
      const __m128i a1 = _mm_unpacklo_epi8(a0, zero);
      const __m128i a2_lo = _mm_unpacklo_epi16(a1, zero);
      const __m128i a2_hi = _mm_unpackhi_epi16(a1, zero);
      // load 8 dst pixels (32 bytes)
      const __m128i b0_lo = _mm_loadu_si128(out + 0);
      const __m128i b0_hi = _mm_loadu_si128(out + 1);
      // mask dst alpha values
      const __m128i b1_lo = _mm_and_si128(b0_lo, rgb_mask);
      const __m128i b1_hi = _mm_and_si128(b0_hi, rgb_mask);
      // combine
      const __m128i b2_lo = _mm_or_si128(b1_lo, a2_lo);
      const __m128i b2_hi = _mm_or_si128(b1_hi, a2_hi);
      // store
      _mm_storeu_si128(out + 0, b2_lo);
      _mm_storeu_si128(out + 1, b2_hi);
      // accumulate eight alpha 'and' in parallel
      all_alphas = _mm_and_si128(all_alphas, a0);
      out += 2;
    }
    for (; i < width; ++i) {
      const uint32_t alpha_value = alpha[i];
      dst[4 * i] = alpha_value;
      alpha_and &= alpha_value;
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }
  // Combine the eight alpha 'and' into a 8-bit mask.
  alpha_and &= _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas, all_0xff));
  return (alpha_and != 0xff);
}